

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void receive_obj_proc(Am_Connection *my_connection_ptr)

{
  bool bVar1;
  ostream *poVar2;
  Am_Object local_28;
  undefined1 local_20 [8];
  Am_Value val;
  Am_Connection *my_connection_ptr_local;
  
  val.value = (anon_union_8_8_ea4c8939_for_value)my_connection_ptr;
  Am_Connection::Receive((Am_Connection *)local_20);
  Am_Object::Am_Object(&local_28,(Am_Value *)local_20);
  bVar1 = Am_Object::operator==(&Am_No_Object,&local_28);
  Am_Object::~Am_Object(&local_28);
  if (!bVar1) {
    std::operator<<((ostream *)&std::cerr,
                    "I expected Unmarshall Object\'s bogus return value and got ");
    poVar2 = operator<<((ostream *)&std::cerr,(Am_Value *)local_20);
    std::operator<<(poVar2," instead! \n");
    Am_Error("Mangled incoming object!");
  }
  Am_Connection::Receive_Object_Slots((Am_Connection *)val.value.wrapper_value);
  Am_Value::~Am_Value((Am_Value *)local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Receive_Method, void, receive_obj,
                 (Am_Connection * my_connection_ptr))
{
  Am_Value val = my_connection_ptr->Receive();
  if (Am_No_Object == (Am_Object)val) {
    my_connection_ptr->Receive_Object_Slots();
  } else {
    std::cerr << "I expected Unmarshall Object's bogus return value and got ";
    std::cerr << val << " instead! \n";
    Am_Error("Mangled incoming object!");
  }
}